

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O1

EigenAnswer *
OppositeRealValues(EigenAnswer *__return_storage_ptr__,Vector *x1,Vector *x2,Vector *x3)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  Vector ans;
  vector<double,_std::allocator<double>_> local_30;
  
  pdVar2 = (x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  dVar5 = 0.0;
  lVar3 = (long)(x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    dVar6 = dVar5;
    do {
      dVar1 = (x1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if (((dVar1 != 0.0) || (dVar5 = dVar6, NAN(dVar1))) &&
         (dVar5 = pdVar2[lVar4] / dVar1, dVar5 <= dVar6)) {
        dVar5 = dVar6;
      }
      lVar4 = lVar4 + 1;
      dVar6 = dVar5;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_30,x3);
  lVar3 = (long)(x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(x3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pdVar2 = (x2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] =
           pdVar2[lVar4] * dVar5 +
           local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->vector,&local_30);
  __return_storage_ptr__->value = dVar5;
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer OppositeRealValues(const Vector &x1, const Vector &x2, const Vector &x3)
{
    double value = 0;
    // average?
    for (int i = 0; i < x3.size(); ++i)
    {
        if (x1[i] != 0)
        {
            value = std::max(value, x3[i] / x1[i]);
        }
    }

    value = std::sqrt(value);

    // second?
    Vector ans = x3;

    for (int i = 0; i < x3.size(); ++i)
    {
        ans[i] += value * x2[i];
    }

    return {.vector = ans, .value = value};
}